

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# braille.hpp
# Opt level: O0

void __thiscall
plot::detail::braille::block_t::block_t
          (block_t *this,Color c,bool px00,bool px01,bool px02,bool px03,bool px10,bool px11,
          bool px12,bool px13)

{
  bool px13_local;
  bool px12_local;
  bool px11_local;
  bool px10_local;
  bool px03_local;
  bool px02_local;
  bool px01_local;
  bool px00_local;
  block_t *this_local;
  Color c_local;
  
  (this->color).r = (float)(int)c._0_8_;
  (this->color).g = (float)(int)((ulong)c._0_8_ >> 0x20);
  (this->color).b = (float)(int)c._8_8_;
  (this->color).a = (float)(int)((ulong)c._8_8_ >> 0x20);
  this->pixels = px00 | px01 * '\x02' | px02 * '\x04' | px03 * '@' | px10 * '\b' | px11 * '\x10' |
                 px12 * ' ' | px13 * -0x80;
  return;
}

Assistant:

constexpr block_t(Color c, bool px00, bool px01, bool px02, bool px03,
                                   bool px10, bool px11, bool px12, bool px13)
            : color(c),
              pixels(pixel_codes[0][0]*px00 | pixel_codes[0][1]*px01 |
                     pixel_codes[0][2]*px02 | pixel_codes[0][3]*px03 |
                     pixel_codes[1][0]*px10 | pixel_codes[1][1]*px11 |
                     pixel_codes[1][2]*px12 | pixel_codes[1][3]*px13)
            {}